

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsIsConstructor(JsValueRef object,bool *isConstructor)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *value;
  undefined4 *puVar6;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (object == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    BVar5 = Js::JavascriptOperators::IsObject(object);
    if (BVar5 == 0) {
      JVar4 = JsErrorArgumentNotObject;
    }
    else {
      value = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003cf992;
        object = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      if (isConstructor == (bool *)0x0) {
        JVar4 = JsErrorNullArgument;
      }
      else {
        bVar3 = Js::JavascriptOperators::IsConstructor(object);
        *isConstructor = bVar3;
        JVar4 = JsNoError;
      }
    }
  }
LAB_003cf992:
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar4;
}

Assistant:

CHAKRA_API JsIsConstructor(_In_ JsValueRef object, _Out_ bool *isConstructor)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(isConstructor);

        *isConstructor = Js::JavascriptOperators::IsConstructor(object);

        return JsNoError;
    });
}